

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

int32_t * res_getIntVector_63(ResourceData *pResData,Resource res,int32_t *pLength)

{
  anon_struct_8_2_41692a41 *local_38;
  int32_t local_30;
  int32_t length;
  uint32_t offset;
  int32_t *p;
  int32_t *pLength_local;
  Resource res_local;
  ResourceData *pResData_local;
  
  if (res >> 0x1c == 0xe) {
    if ((res & 0xfffffff) == 0) {
      local_38 = &gEmpty32;
    }
    else {
      local_38 = (anon_struct_8_2_41692a41 *)(pResData->pRoot + (res & 0xfffffff));
    }
    _length = &local_38->res;
    local_30 = local_38->length;
  }
  else {
    _length = (int32_t *)0x0;
    local_30 = 0;
  }
  if (pLength != (int32_t *)0x0) {
    *pLength = local_30;
  }
  return _length;
}

Assistant:

U_CAPI const int32_t * U_EXPORT2
res_getIntVector(const ResourceData *pResData, Resource res, int32_t *pLength) {
    const int32_t *p;
    uint32_t offset=RES_GET_OFFSET(res);
    int32_t length;
    if(RES_GET_TYPE(res)==URES_INT_VECTOR) {
        p= offset==0 ? (const int32_t *)&gEmpty32 : pResData->pRoot+offset;
        length=*p++;
    } else {
        p=NULL;
        length=0;
    }
    if(pLength) {
        *pLength=length;
    }
    return p;
}